

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcRobustBufferAccessBehaviorTests.cpp
# Opt level: O3

void deqp::RobustBufferAccessBehavior::VertexArray::Generate(Functions *gl,GLuint *out_id)

{
  GLenum err;
  TestError *this;
  GLuint id;
  GLuint local_1c;
  
  local_1c = 0xffffffff;
  (*gl->genVertexArrays)(1,&local_1c);
  err = (*gl->getError)();
  glu::checkError(err,"GenVertexArrays",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                  ,0x3de);
  if (local_1c != 0xffffffff) {
    *out_id = local_1c;
    return;
  }
  this = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this,"Invalid id",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
             ,0x3e2);
  __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void VertexArray::Generate(const glw::Functions& gl, glw::GLuint& out_id)
{
	GLuint id = m_invalid_id;

	gl.genVertexArrays(1, &id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GenVertexArrays");

	if (m_invalid_id == id)
	{
		TCU_FAIL("Invalid id");
	}

	out_id = id;
}